

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

void dg::vr::RelationsAnalyzer::remGen(ValueRelations *graph,BinaryOperator *rem)

{
  Relations RVar1;
  Constant *zero;
  V local_28;
  BinaryOperator *local_20;
  Value *local_18;
  
  local_20 = rem;
  local_28 = (V)llvm::ConstantInt::getSigned(*(Type **)rem,0);
  RVar1 = ValueRelations::_between(graph,local_28,*(V *)(rem + -0x40));
  if (((ulong)RVar1.bits.super__Base_bitset<1UL>._M_w & 4) != 0) {
    ValueRelations::set<llvm::Constant_const*,llvm::BinaryOperator_const*>
              (graph,(Constant **)&local_28,SLE,&local_20);
    local_18 = *(Value **)(local_20 + -0x20);
    ValueRelations::set<llvm::BinaryOperator_const*,llvm::Value*>(graph,&local_20,SLT,&local_18);
  }
  return;
}

Assistant:

void RelationsAnalyzer::remGen(ValueRelations &graph,
                               const llvm::BinaryOperator *rem) {
    assert(rem);
    const llvm::Constant *zero =
            llvm::ConstantInt::getSigned(rem->getType(), 0);

    if (!graph.isLesserEqual(zero, rem->getOperand(0)))
        return;

    graph.setLesserEqual(zero, rem);
    graph.setLesser(rem, rem->getOperand(1));
}